

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::createMaterialFrom(SemanticParser *this,SP *in)

{
  ParamSet *this_00;
  _Base_ptr p_Var1;
  int iVar2;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  char *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<pbrt::Material> sVar5;
  SP SVar6;
  string type;
  undefined1 local_131;
  string local_130;
  long local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  long local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  long local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  long local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  long local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  long local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  long local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  long local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  long local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50;
  
  if (*in_RDX == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"warning: empty material!",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var3._M_pi = extraout_RDX;
    goto LAB_001482d0;
  }
  iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x40));
  this_00 = (ParamSet *)*in_RDX;
  if (iVar2 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"type","");
    syntactic::ParamSet::getParamString(&local_130,this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    p_Var1 = this_00[1].param._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,p_Var1,
               (long)&p_Var1->_M_color +
               (long)&(this_00[1].param._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                      _M_color);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_130);
  if (iVar2 == 0) {
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::Material,std::allocator<pbrt::Material>>
              (&(this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Material **)this,(allocator<pbrt::Material> *)&local_131);
    std::__shared_ptr<pbrt::Material,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::Material,pbrt::Material>
              ((__shared_ptr<pbrt::Material,(__gnu_cxx::_Lock_policy)2> *)this,
               (Material *)
               (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_130);
    if (iVar2 == 0) {
      local_60 = *in_RDX;
      local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_58->_M_use_count = local_58->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_58->_M_use_count = local_58->_M_use_count + 1;
        }
      }
      SVar6 = createMaterial_plastic(this,in);
      _Var3 = SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      this_01 = local_58;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_130);
      if (iVar2 == 0) {
        local_70 = *in_RDX;
        local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_68->_M_use_count = local_68->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_68->_M_use_count = local_68->_M_use_count + 1;
          }
        }
        SVar6 = createMaterial_matte(this,in);
        _Var3 = SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
        this_01 = local_68;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_130);
        if (iVar2 == 0) {
          local_80 = *in_RDX;
          local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
          if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_78->_M_use_count = local_78->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_78->_M_use_count = local_78->_M_use_count + 1;
            }
          }
          SVar6 = createMaterial_metal(this,in);
          _Var3 = SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
          this_01 = local_78;
        }
        else {
          pcVar4 = "fourier";
          iVar2 = std::__cxx11::string::compare((char *)&local_130);
          if (iVar2 == 0) {
            local_90 = *in_RDX;
            local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
            if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_88->_M_use_count = local_88->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_88->_M_use_count = local_88->_M_use_count + 1;
              }
            }
            SVar6 = createMaterial_fourier(this,(SP *)pcVar4);
            _Var3 = SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi;
            this_01 = local_88;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_130);
            if (iVar2 == 0) {
              local_a0 = *in_RDX;
              local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
              if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_98->_M_use_count = local_98->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_98->_M_use_count = local_98->_M_use_count + 1;
                }
              }
              SVar6 = createMaterial_mirror(this,in);
              _Var3 = SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
              this_01 = local_98;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_130);
              if (iVar2 == 0) {
                local_b0 = *in_RDX;
                local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_a8->_M_use_count = local_a8->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_a8->_M_use_count = local_a8->_M_use_count + 1;
                  }
                }
                SVar6 = createMaterial_uber(this,in);
                _Var3 = SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
                this_01 = local_a8;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_130);
                if (iVar2 == 0) {
                  local_c0 = *in_RDX;
                  local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      local_b8->_M_use_count = local_b8->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      local_b8->_M_use_count = local_b8->_M_use_count + 1;
                    }
                  }
                  SVar6 = createMaterial_substrate(this,in);
                  _Var3 = SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                  this_01 = local_b8;
                }
                else {
                  pcVar4 = "disney";
                  iVar2 = std::__cxx11::string::compare((char *)&local_130);
                  if (iVar2 == 0) {
                    local_d0 = *in_RDX;
                    local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                    if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        local_c8->_M_use_count = local_c8->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        local_c8->_M_use_count = local_c8->_M_use_count + 1;
                      }
                    }
                    SVar6 = createMaterial_disney(this,(SP *)pcVar4);
                    _Var3 = SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                    this_01 = local_c8;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)&local_130);
                    if (iVar2 == 0) {
                      local_e0 = *in_RDX;
                      local_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          local_d8->_M_use_count = local_d8->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          local_d8->_M_use_count = local_d8->_M_use_count + 1;
                        }
                      }
                      SVar6 = createMaterial_mix(this,in);
                      _Var3 = SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                      this_01 = local_d8;
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)&local_130);
                      if (iVar2 == 0) {
                        local_f0 = *in_RDX;
                        local_e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                        if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_e8->_M_use_count = local_e8->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_e8->_M_use_count = local_e8->_M_use_count + 1;
                          }
                        }
                        SVar6 = createMaterial_translucent(this,in);
                        _Var3 = SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                        this_01 = local_e8;
                      }
                      else {
                        pcVar4 = "glass";
                        iVar2 = std::__cxx11::string::compare((char *)&local_130);
                        if (iVar2 == 0) {
                          local_100 = *in_RDX;
                          local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                          if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              local_f8->_M_use_count = local_f8->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              local_f8->_M_use_count = local_f8->_M_use_count + 1;
                            }
                          }
                          SVar6 = createMaterial_glass(this,(SP *)pcVar4);
                          _Var3 = SVar6.
                                  super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                          this_01 = local_f8;
                        }
                        else {
                          pcVar4 = "hair";
                          iVar2 = std::__cxx11::string::compare((char *)&local_130);
                          if (iVar2 != 0) {
                            sVar5 = std::make_shared<pbrt::Material>();
                            _Var3 = sVar5.
                                    super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi;
                            goto LAB_001482bd;
                          }
                          local_110 = *in_RDX;
                          local_108 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                          if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              local_108->_M_use_count = local_108->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              local_108->_M_use_count = local_108->_M_use_count + 1;
                            }
                          }
                          SVar6 = createMaterial_hair(this,(SP *)pcVar4);
                          _Var3 = SVar6.
                                  super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                          this_01 = local_108;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      _Var3._M_pi = extraout_RDX_01;
    }
  }
LAB_001482bd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
    _Var3._M_pi = extraout_RDX_02;
  }
LAB_001482d0:
  SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SP)SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterialFrom(pbrt::syntactic::Material::SP in)
  {
    if (!in) {
      std::cerr << "warning: empty material!" << std::endl;
      return Material::SP();
    }
      
    const std::string type = in->type=="" ? in->getParamString("type") : in->type;

    // ==================================================================
    if (type == "") 
      return std::make_shared<Material>();
        
    // ==================================================================
    if (type == "plastic") 
      return createMaterial_plastic(in);
      
    // ==================================================================
    if (type == "matte")
      return createMaterial_matte(in);
      
    // ==================================================================
    if (type == "metal") 
      return createMaterial_metal(in);
      
    // ==================================================================
    if (type == "fourier") 
      return createMaterial_fourier(in);
      
    // ==================================================================
    if (type == "mirror") 
      return createMaterial_mirror(in);
      
    // ==================================================================
    if (type == "uber") 
      return createMaterial_uber(in);
      
    // ==================================================================
    if (type == "substrate") 
      return createMaterial_substrate(in);
      
    // ==================================================================
    if (type == "disney") 
      return createMaterial_disney(in);

    // ==================================================================
    if (type == "mix")
      return createMaterial_mix(in);

    // ==================================================================
    if (type == "translucent")
      return createMaterial_translucent(in);

    // ==================================================================
    if (type == "glass") 
      return createMaterial_glass(in);

    // ==================================================================
    if (type == "hair") 
      return createMaterial_hair(in);

    // ==================================================================
#ifndef NDEBUG
    std::cout << "Warning: un-recognizd material type '"+type+"'" << std::endl;
#endif
    return std::make_shared<Material>();
  }